

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_common.c
# Opt level: O0

void DP_verbose(SstStream s,int Level,char *Format,...)

{
  char in_AL;
  undefined8 in_RCX;
  char *in_RDX;
  int in_ESI;
  long in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  char *Role;
  va_list Args;
  undefined1 local_f8 [24];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  char *local_40;
  undefined4 local_38;
  undefined4 local_34;
  undefined1 *local_30;
  undefined1 *local_28;
  char *local_18;
  int local_c;
  long local_8;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  if (in_ESI <= *(int *)(in_RDI + 0x20)) {
    local_28 = local_f8;
    local_30 = &stack0x00000008;
    local_34 = 0x30;
    local_38 = 0x18;
    local_40 = "BP3Writer";
    if (*(int *)(in_RDI + 0x10) == 0) {
      local_40 = "BP3Reader";
    }
    local_40 = local_40 + 3;
    local_e0 = in_RCX;
    local_d8 = in_R8;
    local_d0 = in_R9;
    local_18 = in_RDX;
    local_c = in_ESI;
    local_8 = in_RDI;
    switch(*(undefined4 *)(in_RDI + 0x1c)) {
    case 1:
    case 4:
    case 5:
      fprintf(_stderr,"DP %s %d (%p): ",local_40,(ulong)*(uint *)(in_RDI + 0xa8),in_RDI);
      break;
    case 2:
      break;
    case 3:
      fprintf(_stderr,"DP %s (%p): ",local_40,in_RDI);
    }
    vfprintf(_stderr,local_18,&local_38);
  }
  return;
}

Assistant:

static void DP_verbose(SstStream s, int Level, char *Format, ...)
{
    if (s->DPVerbosityLevel >= Level)
    {
        va_list Args;
        va_start(Args, Format);
        char *Role = "Writer";
        if (s->Role == ReaderRole)
        {
            Role = "Reader";
        }
        switch (s->CPVerbosityLevel)
        {
        case TraceVerbose:
        case PerRankVerbose:
        case CriticalVerbose:
            fprintf(stderr, "DP %s %d (%p): ", Role, s->Rank, s);
            break;
        case PerStepVerbose:
            fprintf(stderr, "DP %s (%p): ", Role, s);
            break;
        case SummaryVerbose:
        default:
            break;
        }
        vfprintf(stderr, Format, Args);
        va_end(Args);
    }
}